

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O1

void __thiscall
QPDFAcroFormDocumentHelper::traverseField
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *field,QPDFObjectHandle *parent,
          int depth,set *visited)

{
  element_type *peVar1;
  bool bVar2;
  __index_type _Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar7;
  iterator iVar8;
  iterator iVar9;
  vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *this_00;
  mapped_type *pmVar10;
  iterator iVar11;
  mapped_type *this_01;
  mapped_type *pmVar12;
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  *this_02;
  QPDFObjGen QVar13;
  QPDFAcroFormDocumentHelper *pQVar14;
  QPDFFormFieldObjectHelper foh;
  Array a;
  QPDFObjGen f_og;
  QPDFObjGen og;
  string old_name;
  string name;
  QPDFFormFieldObjectHelper local_168;
  QPDFAcroFormDocumentHelper *local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [24];
  undefined1 local_100 [16];
  undefined1 local_f0 [32];
  QPDFObjectHandle local_d0;
  QPDFObjectHandle local_c0;
  QPDFObjectHandle local_b0;
  QPDFObjGen local_a0;
  QPDFObjGen local_98;
  key_type local_90;
  string local_70;
  string local_50;
  
  if (100 < depth) {
    return;
  }
  bVar2 = QPDFObjectHandle::isIndirect(field);
  if (!bVar2) {
    local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)
         &local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,
               "encountered a direct object as a field or annotation while traversing /AcroForm; ignoring field or annotation"
               ,"");
    QPDFObjectHandle::warnIfPossible(field,(string *)&local_168);
LAB_0014fd7c:
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
        &local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete(local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    return;
  }
  bVar2 = QPDFObjectHandle::isDictionary(field);
  if (!bVar2) {
    local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)
         &local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,
               "encountered a non-dictionary as a field or annotation while traversing /AcroForm; ignoring field or annotation"
               ,"");
    QPDFObjectHandle::warnIfPossible(field,(string *)&local_168);
    goto LAB_0014fd7c;
  }
  local_98 = QPDFObjectHandle::getObjGen(field);
  bVar2 = QPDFObjGen::set::add(visited,local_98);
  if (!bVar2) {
    local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)
         &local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"loop detected while traversing /AcroForm","");
    QPDFObjectHandle::warnIfPossible(field,(string *)&local_168);
    goto LAB_0014fd7c;
  }
  QVar13 = (QPDFObjGen)
           &local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)QVar13;
  local_130 = this;
  local_a0 = (QPDFObjGen)parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"/Kids","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_100,(string *)field);
  if ((element_type *)local_100._0_8_ == (element_type *)0x0) {
    _Var3 = '\0';
  }
  else {
    _Var3 = *(__index_type *)(local_100._0_8_ + 0x30);
    if (_Var3 == '\x0f') {
      pvVar7 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         ((variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           *)local_100._0_8_);
    }
    else {
      if (_Var3 != '\r') goto LAB_0014fdba;
      pvVar7 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)QPDF::resolve(*(QPDF **)(local_100._0_8_ + 0x48),
                                *(QPDFObjGen *)(local_100._0_8_ + 0x50));
    }
    _Var3 = *(__index_type *)
             ((long)&(((pvVar7->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             + 0x30);
  }
LAB_0014fdba:
  if (_Var3 == '\b') {
    local_128._0_8_ = local_100._0_8_;
    local_128._8_8_ = local_100._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_100._8_8_ + 8) = *(_Atomic_word *)(local_100._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_100._8_8_ + 8) = *(_Atomic_word *)(local_100._8_8_ + 8) + 1;
      }
    }
  }
  else {
    local_128._0_8_ = (element_type *)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  local_118._0_8_ = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
  }
  if ((QPDFObjGen)local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper != QVar13) {
    operator_delete(local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((element_type *)local_128._0_8_ != (element_type *)0x0) {
    iVar8 = ::qpdf::Array::begin((Array *)local_128);
    iVar9 = ::qpdf::Array::end((Array *)local_128);
    bVar2 = true;
    if (iVar8._M_current != iVar9._M_current) {
      do {
        local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = ((iVar8._M_current)->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             ((iVar8._M_current)->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_b0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_b0.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_b0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_b0.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (field->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (field->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_c0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_c0.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_c0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_c0.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        traverseField(local_130,&local_b0,&local_c0,depth + 1,visited);
        if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        iVar8._M_current = iVar8._M_current + 1;
      } while (iVar8._M_current != iVar9._M_current);
    }
    bVar6 = false;
    goto LAB_00150074;
  }
  local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)QVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"/Parent","");
  bVar2 = QPDFObjectHandle::hasKey(field,(string *)&local_168);
  if ((QPDFObjGen)local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper != QVar13) {
    operator_delete(local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)QVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"/Subtype","");
  bVar4 = QPDFObjectHandle::hasKey(field,(string *)&local_168);
  bVar6 = true;
  if (bVar4) {
LAB_0014ffc5:
    bVar5 = false;
  }
  else {
    local_100._0_8_ = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"/Rect","");
    bVar5 = QPDFObjectHandle::hasKey(field,(string *)local_100);
    if (bVar5) goto LAB_0014ffc5;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/AP","");
    bVar6 = QPDFObjectHandle::hasKey(field,&local_50);
    bVar5 = true;
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar4) && ((element_type *)local_100._0_8_ != (element_type *)local_f0)) {
    operator_delete((void *)local_100._0_8_,local_f0._0_8_ + 1);
  }
  if ((QPDFObjGen)local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper != QVar13) {
    operator_delete(local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  bVar2 = depth == 0 || bVar2;
LAB_00150074:
  pQVar14 = local_130;
  std::
  unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                 *)local_118);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
  }
  if (bVar6 != false) {
    QVar13 = local_a0;
    if (bVar2) {
      QVar13 = (QPDFObjGen)field;
    }
    local_128._0_8_ = *(undefined8 *)QVar13;
    local_128._8_8_ = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)QVar13 + 8))->_M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_M_use_count + 1;
      }
    }
    peVar1 = (pQVar14->m).
             super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_168.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_128);
    this_00 = (vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *)
              std::
              map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
              ::operator[](&peVar1->field_to_annotations,(key_type *)&local_168);
    std::vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>::
    emplace_back<QPDFObjectHandle&>(this_00,field);
    local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_128._0_8_;
    local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_128._8_8_ + 8) = *(_Atomic_word *)(local_128._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_128._8_8_ + 8) = *(_Atomic_word *)(local_128._8_8_ + 8) + 1;
      }
    }
    QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_168,&local_d0);
    pmVar10 = std::
              map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
              ::operator[](&((pQVar14->m).
                             super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->annotation_to_field,&local_98);
    (pmVar10->super_QPDFObjectHelper).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar10->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_168.super_QPDFObjectHelper.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    (pmVar10->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_168.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar10->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_168.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
    (pmVar10->m).super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_168.m.
             super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar10->m).
                super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &local_168.m.
                super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_168);
    if (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    pQVar14 = local_130;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
      pQVar14 = local_130;
    }
  }
  if (bVar2) {
    local_128._0_8_ = (element_type *)local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/T","");
    bVar2 = QPDFObjectHandle::hasKey(field,(string *)local_128);
    if ((element_type *)local_128._0_8_ != (element_type *)local_118) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_118._0_8_ + 1));
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar2 == false) {
    return;
  }
  local_f0._16_8_ =
       (field->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_f0._24_8_ =
       (field->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_)->_M_use_count + 1;
    }
  }
  QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
            (&local_168,(QPDFObjectHandle *)(local_f0 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_);
  }
  local_118._16_8_ = QPDFObjectHandle::getObjGen(field);
  QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_(&local_70,&local_168);
  iVar11 = std::
           _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&(((pQVar14->m).
                     super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->field_to_name)._M_t,(key_type *)(local_118 + 0x10));
  if ((_Rb_tree_header *)iVar11._M_node !=
      &(((pQVar14->m).
         super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
       ->field_to_name)._M_t._M_impl.super__Rb_tree_header) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,iVar11._M_node[1]._M_parent,
               (long)&(iVar11._M_node[1]._M_parent)->_M_color +
               (long)&(iVar11._M_node[1]._M_left)->_M_color);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
              ::operator[](&((pQVar14->m).
                             super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->name_to_fields,&local_90);
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::erase
              (this_01,(key_type *)(local_118 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  pmVar12 = std::
            map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&((pQVar14->m).
                           super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->field_to_name,(key_type *)(local_118 + 0x10));
  std::__cxx11::string::_M_assign((string *)pmVar12);
  this_02 = (_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
               ::operator[](&((pQVar14->m).
                              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->name_to_fields,&local_70);
  std::
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  ::_M_insert_unique<QPDFObjGen_const&>(this_02,(QPDFObjGen *)(local_118 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_168);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::traverseField(
    QPDFObjectHandle field, QPDFObjectHandle parent, int depth, QPDFObjGen::set& visited)
{
    if (depth > 100) {
        // Arbitrarily cut off recursion at a fixed depth to avoid specially crafted files that
        // could cause stack overflow.
        return;
    }
    if (!field.isIndirect()) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper direct field");
        field.warnIfPossible(
            "encountered a direct object as a field or annotation while "
            "traversing /AcroForm; ignoring field or annotation");
        return;
    }
    if (!field.isDictionary()) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper non-dictionary field");
        field.warnIfPossible(
            "encountered a non-dictionary as a field or annotation while"
            " traversing /AcroForm; ignoring field or annotation");
        return;
    }
    QPDFObjGen og(field.getObjGen());
    if (!visited.add(og)) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper loop");
        field.warnIfPossible("loop detected while traversing /AcroForm");
        return;
    }

    // A dictionary encountered while traversing the /AcroForm field may be a form field, an
    // annotation, or the merger of the two. A field that has no fields below it is a terminal. If a
    // terminal field looks like an annotation, it is an annotation because annotation dictionary
    // fields can be merged with terminal field dictionaries. Otherwise, the annotation fields might
    // be there to be inherited by annotations below it.

    bool is_annotation = false;
    bool is_field = (0 == depth);
    if (auto a = field.getKey("/Kids").as_array(strict)) {
        is_field = true;
        for (auto const& item: a) {
            traverseField(item, field, 1 + depth, visited);
        }
    } else {
        if (field.hasKey("/Parent")) {
            is_field = true;
        }
        if (field.hasKey("/Subtype") || field.hasKey("/Rect") || field.hasKey("/AP")) {
            is_annotation = true;
        }
    }

    QTC::TC("qpdf", "QPDFAcroFormDocumentHelper field found", (depth == 0) ? 0 : 1);
    QTC::TC("qpdf", "QPDFAcroFormDocumentHelper annotation found", (is_field ? 0 : 1));

    if (is_annotation) {
        QPDFObjectHandle our_field = (is_field ? field : parent);
        m->field_to_annotations[our_field.getObjGen()].emplace_back(field);
        m->annotation_to_field[og] = QPDFFormFieldObjectHelper(our_field);
    }

    if (is_field && (field.hasKey("/T"))) {
        QPDFFormFieldObjectHelper foh(field);
        auto f_og = field.getObjGen();
        std::string name = foh.getFullyQualifiedName();
        auto old = m->field_to_name.find(f_og);
        if (old != m->field_to_name.end()) {
            // We might be updating after a name change, so remove any old information
            std::string old_name = old->second;
            m->name_to_fields[old_name].erase(f_og);
        }
        m->field_to_name[f_og] = name;
        m->name_to_fields[name].insert(f_og);
    }
}